

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyDropSections(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  long lVar2;
  int iVar3;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  lexer = (Lexer *)node;
LAB_0015a35c:
  do {
    while( true ) {
      if (lexer == (Lexer *)0x0) {
        return;
      }
      if (*(int *)&lexer->root == 9) break;
      lVar2._0_4_ = lexer->exiled;
      lVar2._4_4_ = lexer->isvoyager;
      if (lVar2 != 0) {
        prvTidyDropSections(doc,*(Node **)&lexer->exiled);
      }
      lexer = *(Lexer **)&lexer->insertspace;
    }
    iVar3 = prvTidytmbstrncmp(pLVar1->lexbuf + *(uint *)&lexer->itoken,"if",2);
    if (iVar3 == 0) {
      iVar3 = prvTidytmbstrncmp(pLVar1->lexbuf + *(uint *)&lexer->itoken,"if !vml",7);
      if (iVar3 != 0) {
        lexer = (Lexer *)PruneSection(doc,(Node *)lexer);
        goto LAB_0015a35c;
      }
    }
    lexer = (Lexer *)prvTidyDiscardElement(doc,(Node *)lexer);
  } while( true );
}

Assistant:

void TY_(DropSections)( TidyDocImpl* doc, Node* node )
{
    Lexer* lexer = doc->lexer;
    while (node)
    {
        if (node->type == SectionTag)
        {
            /* prune up to matching endif */
            if ((TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0) &&
                (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if !vml", 7) != 0)) /* #444394 - fix 13 Sep 01 */
            {
                node = PruneSection( doc, node );
                continue;
            }

            /* discard others as well */
            node = TY_(DiscardElement)( doc, node );
            continue;
        }

        if (node->content)
            TY_(DropSections)( doc, node->content );

        node = node->next;
    }
}